

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerObjectDumper.cpp
# Opt level: O1

void RecyclerObjectDumper::DumpObject(type_info *typeinfo,bool isArray,void *objectAddress)

{
  bool bVar1;
  char16_t *form;
  _func_bool_type_info_ptr_bool_void_ptr *local_28;
  DumpFunction dumpFunction;
  type_info *typeinfo_local;
  
  dumpFunction = (DumpFunction)typeinfo;
  if (typeinfo == (type_info *)0x0) {
    Output::Print(L"Address %p",objectAddress);
    return;
  }
  if (((dumpFunctionMap != (DumpFunctionMap *)0x0) &&
      (bVar1 = JsUtil::
               BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
               ::TryGetValue<std::type_info_const*>
                         ((BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                           *)dumpFunctionMap,(type_info **)&dumpFunction,&local_28), bVar1)) &&
     (bVar1 = (*local_28)((type_info *)dumpFunction,isArray,objectAddress), bVar1)) {
    return;
  }
  form = L"%S %p";
  if (isArray) {
    form = L"%S[] %p";
  }
  Output::Print(form,*(char **)(dumpFunction + 8) + (**(char **)(dumpFunction + 8) == '*'),
                objectAddress);
  return;
}

Assistant:

void
RecyclerObjectDumper::DumpObject(type_info const * typeinfo, bool isArray, void * objectAddress)
{
    if (typeinfo == nullptr)
    {
        Output::Print(_u("Address %p"), objectAddress);
    }
    else
    {
        DumpFunction dumpFunction;
        if (dumpFunctionMap == nullptr || !dumpFunctionMap->TryGetValue(typeinfo, &dumpFunction) || !dumpFunction(typeinfo, isArray, objectAddress))
        {
            Output::Print(isArray? _u("%S[] %p") : _u("%S %p"), typeinfo->name(), objectAddress);
        }
    }
}